

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode N_VBufUnpack_Serial(N_Vector x,void *buf)

{
  long lVar1;
  long lVar2;
  sunrealtype *bd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  void *buf_local;
  N_Vector x_local;
  
  lVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 0x10);
  for (i = 0; i < lVar1; i = i + 1) {
    *(undefined8 *)(lVar2 + i * 8) = *(undefined8 *)((long)buf + i * 8);
  }
  return 0;
}

Assistant:

SUNErrCode N_VBufUnpack_Serial(N_Vector x, void* buf)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i, N;
  sunrealtype* xd = NULL;
  sunrealtype* bd = NULL;

  SUNAssert(buf, SUN_ERR_ARG_CORRUPT);

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  bd = (sunrealtype*)buf;

  for (i = 0; i < N; i++) { xd[i] = bd[i]; }

  return SUN_SUCCESS;
}